

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

void Abc_End(Abc_Frame_t *pAbc)

{
  int iVar1;
  Abc_Frame_t *pAVar2;
  
  Cnf_ManFree();
  Abc_NtkCompareAndSaveBest((Abc_Ntk_t *)0x0);
  Dar_LibStop();
  Aig_RManQuit();
  Npn_ManClean();
  Sdm_ManQuit();
  Abc_NtkFraigStoreClean();
  pAVar2 = Abc_FrameGetGlobalFrame();
  if (pAVar2->pGia != (Gia_Man_t *)0x0) {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Gia_ManStop(pAVar2->pGia);
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  if (pAVar2->pGia2 != (Gia_Man_t *)0x0) {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Gia_ManStop(pAVar2->pGia2);
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  if (pAVar2->pGiaBest != (Gia_Man_t *)0x0) {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Gia_ManStop(pAVar2->pGiaBest);
  }
  iVar1 = Abc_NtkRecIsRunning3();
  if (iVar1 != 0) {
    Abc_NtkRecStop3();
    return;
  }
  return;
}

Assistant:

void Abc_End( Abc_Frame_t * pAbc )
{
    extern Abc_Frame_t * Abc_FrameGetGlobalFrame();
    Abc_FrameClearDesign();
    Cnf_ManFree();
    {
        extern int Abc_NtkCompareAndSaveBest( Abc_Ntk_t * pNtk );
        Abc_NtkCompareAndSaveBest( NULL );
    }
    {
        extern void Dar_LibStop();
        Dar_LibStop();
    }
    {
        extern void Aig_RManQuit();
        Aig_RManQuit();
    }
    {
        extern void Npn_ManClean();
        Npn_ManClean();
    }
    {
        extern void Sdm_ManQuit();
        Sdm_ManQuit();
    }
    Abc_NtkFraigStoreClean();
    if ( Abc_FrameGetGlobalFrame()->pGia )
        Gia_ManStop( Abc_FrameGetGlobalFrame()->pGia );
    if ( Abc_FrameGetGlobalFrame()->pGia2 )
        Gia_ManStop( Abc_FrameGetGlobalFrame()->pGia2 );
    if ( Abc_FrameGetGlobalFrame()->pGiaBest )
        Gia_ManStop( Abc_FrameGetGlobalFrame()->pGiaBest );
    if ( Abc_NtkRecIsRunning3() )
        Abc_NtkRecStop3();
}